

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * __thiscall
nlohmann::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  size_type *psVar1;
  bool bVar2;
  undefined8 uVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  string __str_1;
  string __str;
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  uVar11 = *(long *)&(this->super_exception).m + 1;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar9 = uVar11;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001b64ba;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001b64ba;
      }
      if (uVar9 < 10000) goto LAB_001b64ba;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_001b64ba:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,uVar11);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2859dd);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_80 = *puVar8;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar8;
    local_90 = (ulong *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar11 = *(ulong *)&(this->super_exception).id;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar9 = uVar11;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_001b65fa;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_001b65fa;
      }
      if (uVar9 < 10000) goto LAB_001b65fa;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_001b65fa:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,uVar11);
  uVar11 = CONCAT44(uStack_a4,local_a8) + local_88;
  uVar9 = 0xf;
  if (local_90 != &local_80) {
    uVar9 = local_80;
  }
  if (uVar9 < uVar11) {
    uVar9 = 0xf;
    if (local_b0 != local_a0) {
      uVar9 = local_a0[0];
    }
    if (uVar11 <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_001b667e;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_001b667e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar3 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return " at line " + std::to_string(pos.lines_read + 1) +
               ", column " + std::to_string(pos.chars_read_current_line);
    }